

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O0

void highwayhash::CountingSort<unsigned_int>(uint *begin,uint *end)

{
  bool bVar1;
  pointer ppVar2;
  iterator __first;
  iterator __last;
  reference __value;
  pair<unsigned_int,_int> *value_count;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *__range2;
  uint *p;
  int local_84;
  pair<unsigned_int,_int> local_80;
  __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  local_78 [3];
  uint local_5c;
  pair<unsigned_int,_int> *local_58;
  __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  local_50;
  __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  local_48;
  __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
  pos;
  pointer ppStack_38;
  uint value;
  uint *p_1;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> unique;
  uint *end_local;
  uint *begin_local;
  
  unique.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)end;
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&p_1);
  for (ppStack_38 = (pointer)begin;
      ppStack_38 !=
      unique.
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage; ppStack_38 = (pointer)&ppStack_38->second)
  {
    pos._M_current._4_4_ = ppStack_38->first;
    local_50._M_current =
         (pair<unsigned_int,_int> *)
         std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
         begin((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                *)&p_1);
    local_58 = (pair<unsigned_int,_int> *)
               std::
               vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               ::end((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                      *)&p_1);
    local_5c = pos._M_current._4_4_;
    local_48 = std::
               find_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>,highwayhash::CountingSort<unsigned_int>(unsigned_int*,unsigned_int*)::_lambda(std::pair<unsigned_int,int>const&)_1_>
                         (local_50,(__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                                    )local_58,pos._M_current._4_4_);
    local_78[0]._M_current =
         (pair<unsigned_int,_int> *)
         std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
         end((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&p_1);
    bVar1 = __gnu_cxx::operator==(&local_48,local_78);
    if (bVar1) {
      local_84 = 1;
      local_80 = std::make_pair<unsigned_int_const&,int>(&ppStack_38->first,&local_84);
      std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
      push_back((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                 *)&p_1,&local_80);
    }
    else {
      ppVar2 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
               ::operator->(&local_48);
      ppVar2->second = ppVar2->second + 1;
    }
  }
  __first = std::
            vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
            begin((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                   *)&p_1);
  __last = std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           ::end((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                  *)&p_1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,int>*,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>>>
            ((__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
              )__last._M_current);
  __end0 = std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           ::begin((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                    *)&p_1);
  value_count = (pair<unsigned_int,_int> *)
                std::
                vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                ::end((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                       *)&p_1);
  __range2 = (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )begin;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                                *)&value_count);
    if (!bVar1) break;
    __value = __gnu_cxx::
              __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
              ::operator*(&__end0);
    std::fill<unsigned_int*,unsigned_int>
              ((uint *)__range2,
               (uint *)((long)&(__range2->
                               super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                               )._M_impl.super__Vector_impl_data._M_start +
                       (long)__value->second * 4),&__value->first);
    __range2 = (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                *)((long)&(__range2->
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + (long)__value->second * 4);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
    ::operator++(&__end0);
  }
  if ((pointer)__range2 ==
      unique.
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
    ~vector((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *)
            &p_1);
    return;
  }
  __assert_fail("p == end",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                ,0x68,"void highwayhash::CountingSort(T *, T *) [T = unsigned int]");
}

Assistant:

void CountingSort(T* begin, T* end) {
  // Unique values and their frequency (similar to flat_map).
  using Unique = std::pair<T, int>;
  std::vector<Unique> unique;
  for (const T* p = begin; p != end; ++p) {
    const T value = *p;
    const auto pos =
        std::find_if(unique.begin(), unique.end(),
                     [value](const Unique& u) { return u.first == value; });
    if (pos == unique.end()) {
      unique.push_back(std::make_pair(*p, 1));
    } else {
      ++pos->second;
    }
  }

  // Sort in ascending order of value (pair.first).
  std::sort(unique.begin(), unique.end());

  // Write that many copies of each unique value to the array.
  T* HH_RESTRICT p = begin;
  for (const auto& value_count : unique) {
    std::fill(p, p + value_count.second, value_count.first);
    p += value_count.second;
  }
  assert(p == end);
}